

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PendingTermsAdd(Fts3Table *p,int iLangid,char *zText,int iCol,u32 *pnWord)

{
  int nToken_00;
  _func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr *p_Var1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  sqlite3_tokenizer_module *psVar6;
  int nToken;
  int iPos;
  int iEnd;
  int iStart;
  char *zToken;
  sqlite3_tokenizer_cursor *pCsr;
  int local_74;
  int local_70;
  int local_6c;
  int local_68 [2];
  char *local_60;
  sqlite3_tokenizer_module *local_58;
  u32 *local_50;
  sqlite3_tokenizer_cursor *local_48;
  _func_int_sqlite3_tokenizer_cursor_ptr_char_ptr_ptr_int_ptr_int_ptr_int_ptr_int_ptr *local_40;
  sqlite3_tokenizer_cursor *local_38;
  
  iVar2 = 0;
  local_68[1] = 0;
  local_68[0] = 0;
  local_70 = 0;
  local_74 = 0;
  if (zText == (char *)0x0) {
    *pnWord = 0;
  }
  else {
    psVar6 = p->pTokenizer->pModule;
    local_6c = iCol;
    iVar2 = sqlite3Fts3OpenTokenizer(p->pTokenizer,iLangid,zText,-1,&local_38);
    if (iVar2 == 0) {
      p_Var1 = psVar6->xNext;
      local_48 = local_38;
      iVar3 = (*p_Var1)(local_38,&local_60,&local_74,local_68 + 1,local_68,&local_70);
      if (iVar3 == 0) {
        iVar2 = 0;
        local_58 = psVar6;
        local_50 = pnWord;
        local_40 = p_Var1;
        while( true ) {
          pnWord = local_50;
          psVar6 = local_58;
          iVar3 = local_70 + 1;
          if (local_70 < iVar2) {
            iVar3 = iVar2;
          }
          iVar2 = iVar3;
          iVar3 = 1;
          if ((((local_70 < 0) || (local_60 == (char *)0x0)) || (local_74 < 1)) ||
             (iVar3 = fts3PendingTermsAddOne
                                (p,local_6c,local_70,&p->aIndex->hPending,local_60,local_74),
             iVar3 != 0)) break;
          lVar4 = 0x30;
          lVar5 = 0;
          while (lVar5 = lVar5 + 1, lVar5 < p->nIndex) {
            nToken_00 = *(int *)((long)p->aIndex + lVar4 + -8);
            iVar3 = 0;
            if (nToken_00 <= local_74) {
              iVar3 = fts3PendingTermsAddOne
                                (p,local_6c,local_70,(Fts3Hash *)((long)&p->aIndex->nPrefix + lVar4)
                                 ,local_60,nToken_00);
            }
            lVar4 = lVar4 + 0x28;
            pnWord = local_50;
            psVar6 = local_58;
            if (iVar3 != 0) goto LAB_001d7d0e;
          }
          iVar3 = (*local_40)(local_48,&local_60,&local_74,local_68 + 1,local_68,&local_70);
          pnWord = local_50;
          psVar6 = local_58;
          if (iVar3 != 0) break;
        }
      }
      else {
        iVar2 = 0;
      }
LAB_001d7d0e:
      (*psVar6->xClose)(local_48);
      *pnWord = *pnWord + iVar2;
      iVar2 = 0;
      if (iVar3 != 0x65) {
        iVar2 = iVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts3PendingTermsAdd(
  Fts3Table *p,                   /* Table into which text will be inserted */
  int iLangid,                    /* Language id to use */
  const char *zText,              /* Text of document to be inserted */
  int iCol,                       /* Column into which text is being inserted */
  u32 *pnWord                     /* IN/OUT: Incr. by number tokens inserted */
){
  int rc;
  int iStart = 0;
  int iEnd = 0;
  int iPos = 0;
  int nWord = 0;

  char const *zToken;
  int nToken = 0;

  sqlite3_tokenizer *pTokenizer = p->pTokenizer;
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr;
  int (*xNext)(sqlite3_tokenizer_cursor *pCursor,
      const char**,int*,int*,int*,int*);

  assert( pTokenizer && pModule );

  /* If the user has inserted a NULL value, this function may be called with
  ** zText==0. In this case, add zero token entries to the hash table and 
  ** return early. */
  if( zText==0 ){
    *pnWord = 0;
    return SQLITE_OK;
  }

  rc = sqlite3Fts3OpenTokenizer(pTokenizer, iLangid, zText, -1, &pCsr);
  if( rc!=SQLITE_OK ){
    return rc;
  }

  xNext = pModule->xNext;
  while( SQLITE_OK==rc
      && SQLITE_OK==(rc = xNext(pCsr, &zToken, &nToken, &iStart, &iEnd, &iPos))
  ){
    int i;
    if( iPos>=nWord ) nWord = iPos+1;

    /* Positions cannot be negative; we use -1 as a terminator internally.
    ** Tokens must have a non-zero length.
    */
    if( iPos<0 || !zToken || nToken<=0 ){
      rc = SQLITE_ERROR;
      break;
    }

    /* Add the term to the terms index */
    rc = fts3PendingTermsAddOne(
        p, iCol, iPos, &p->aIndex[0].hPending, zToken, nToken
    );
    
    /* Add the term to each of the prefix indexes that it is not too 
    ** short for. */
    for(i=1; rc==SQLITE_OK && i<p->nIndex; i++){
      struct Fts3Index *pIndex = &p->aIndex[i];
      if( nToken<pIndex->nPrefix ) continue;
      rc = fts3PendingTermsAddOne(
          p, iCol, iPos, &pIndex->hPending, zToken, pIndex->nPrefix
      );
    }
  }

  pModule->xClose(pCsr);
  *pnWord += nWord;
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}